

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::MockEndpoint::MockEndpoint
          (MockEndpoint *this,event_base *aEventBase,Address *aAddr,uint16_t aPort)

{
  uint16_t aPort_local;
  Address *aAddr_local;
  event_base *aEventBase_local;
  MockEndpoint *this_local;
  
  Endpoint::Endpoint(&this->super_Endpoint);
  (this->super_Endpoint)._vptr_Endpoint = (_func_int **)&PTR__MockEndpoint_003ecaf0;
  Address::Address(&this->mAddr,aAddr);
  this->mPort = aPort;
  this->mPeer = (MockEndpoint *)0x0;
  this->mDropMessage = false;
  std::
  queue<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::
  queue<std::deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((queue<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              *)&this->mSendQueue);
  event_assign(&this->mSendEvent,aEventBase,-1,0x10,SendEventCallback,this);
  event_add(&this->mSendEvent,(timeval *)0x0);
  return;
}

Assistant:

MockEndpoint(struct event_base *aEventBase, const Address &aAddr, uint16_t aPort)
        : mAddr(aAddr)
        , mPort(aPort)
        , mPeer(nullptr)
        , mDropMessage(false)
    {
        event_assign(&mSendEvent, aEventBase, -1, EV_PERSIST, SendEventCallback, this);
        event_add(&mSendEvent, nullptr);
    }